

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

void zdscal(int n,double sa,complex<double> *cx,int incx)

{
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM1_Qa;
  int local_28;
  int i;
  int incx_local;
  complex<double> *cx_local;
  double sa_local;
  int n_local;
  
  if ((0 < n) && (0 < incx)) {
    cx_local = (complex<double> *)sa;
    sa_local._4_4_ = n;
    if (incx == 1) {
      for (local_28 = 0; local_28 < sa_local._4_4_; local_28 = local_28 + 1) {
        std::operator*((double *)&cx_local,cx + local_28);
        *(undefined8 *)cx[local_28]._M_value = extraout_XMM0_Qa;
        *(undefined8 *)(cx[local_28]._M_value + 8) = in_XMM1_Qa;
      }
    }
    else {
      for (local_28 = 0; local_28 < sa_local._4_4_; local_28 = local_28 + 1) {
        std::operator*((double *)&cx_local,cx + local_28 * incx);
        *(undefined8 *)cx[local_28 * incx]._M_value = extraout_XMM0_Qa_00;
        *(undefined8 *)(cx[local_28 * incx]._M_value + 8) = in_XMM1_Qa;
      }
    }
  }
  return;
}

Assistant:

void zdscal ( int n, double sa, complex <double> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ZDSCAL scales a complex <double> vector by a double.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The scaling constant is double precision real.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double SA, the multiplier.
//
//    Input/output, complex <double> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of
//    the vector CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = sa * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = sa * cx[i*incx];
    }
  }
  return;
}